

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O3

void __thiscall webrtc::NonlinearBeamformer::InitTargetCovMats(NonlinearBeamformer *this)

{
  Matrix<std::complex<float>_> *this_00;
  _ComplexT _Var1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  pointer ppcVar4;
  ComplexMatrixF *pCVar5;
  string *result;
  size_t sVar6;
  size_t sVar7;
  int line;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  float fVar12;
  undefined8 uVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  size_t local_1c8;
  ComplexMatrixF *local_1c0;
  ComplexMatrixF *local_1b8;
  NonlinearBeamformer *local_1b0;
  FatalMessage local_1a8;
  
  local_1c0 = this->target_cov_mats_;
  local_1b8 = this->delay_sum_masks_;
  lVar10 = 0;
  local_1b0 = this;
  do {
    pCVar5 = local_1b8;
    this_00 = &local_1c0[lVar10].super_Matrix<std::complex<float>_>;
    sVar6 = local_1b0->num_input_channels_;
    if ((local_1c0[lVar10].super_Matrix<std::complex<float>_>.num_rows_ != sVar6) ||
       (local_1c0[lVar10].super_Matrix<std::complex<float>_>.num_columns_ != sVar6)) {
      this_00->num_rows_ = sVar6;
      this_00->num_columns_ = sVar6;
      Matrix<std::complex<float>_>::Resize(this_00);
    }
    local_1c8 = CONCAT44(local_1c8._4_4_,1);
    local_1a8._0_8_ = pCVar5[lVar10].super_Matrix<std::complex<float>_>.num_rows_;
    if (local_1a8._0_8_ != 1) {
      result = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                         ((uint *)&local_1c8,(unsigned_long *)&local_1a8,"1u == in.num_rows()");
      if (result != (string *)0x0) {
        line = 0x99;
        goto LAB_00175b83;
      }
    }
    local_1a8._0_8_ = this_00->num_rows_;
    local_1c8 = pCVar5[lVar10].super_Matrix<std::complex<float>_>.num_columns_;
    if (local_1a8._0_8_ != local_1c8) {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_1a8,&local_1c8,
                          "out->num_rows() == in.num_columns()");
      if (result != (string *)0x0) {
        line = 0x9a;
        goto LAB_00175b83;
      }
      local_1a8._0_8_ = pCVar5[lVar10].super_Matrix<std::complex<float>_>.num_columns_;
    }
    sVar6 = this_00->num_columns_;
    local_1c8 = local_1a8._0_8_;
    if (sVar6 != local_1a8._0_8_) {
      local_1a8._0_8_ = sVar6;
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_1a8,&local_1c8,
                          "out->num_columns() == in.num_columns()");
      sVar6 = local_1a8._0_8_;
      if (result != (string *)0x0) {
        line = 0x9b;
LAB_00175b83:
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/nonlinear_beamformer.cc"
                   ,line,result);
        rtc::FatalMessage::~FatalMessage(&local_1a8);
      }
    }
    local_1a8._0_8_ = sVar6;
    sVar6 = this_00->num_rows_;
    if (sVar6 != 0) {
      pcVar3 = *pCVar5[lVar10].super_Matrix<std::complex<float>_>.elements_.
                super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar4 = (this_00->elements_).
                super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar7 = this_00->num_columns_;
      uVar8 = 0;
      do {
        if (sVar7 == 0) {
          sVar7 = 0;
        }
        else {
          uVar9 = 0;
          do {
            _Var1 = pcVar3[uVar8]._M_value;
            _Var2 = pcVar3[uVar9]._M_value;
            fVar12 = (float)(_Var1 >> 0x20);
            fVar14 = (float)(_Var2 >> 0x20);
            fVar13 = fVar14 * fVar12 + (float)_Var2 * (float)_Var1;
            fVar15 = fVar12 * (float)_Var2 - (float)_Var1 * fVar14;
            if ((NAN(fVar13)) && (NAN(fVar15))) {
              uVar11 = __mulsc3(_Var1,fVar12,_Var2,-fVar14);
              fVar13 = (float)uVar11;
              fVar15 = (float)((ulong)uVar11 >> 0x20);
            }
            ppcVar4[uVar8][uVar9]._M_value = CONCAT44(fVar15,fVar13);
            uVar9 = uVar9 + 1;
            sVar7 = this_00->num_columns_;
          } while (uVar9 < sVar7);
          sVar6 = this_00->num_rows_;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < sVar6);
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 0x81) {
      return;
    }
  } while( true );
}

Assistant:

void NonlinearBeamformer::InitTargetCovMats() {
  for (size_t i = 0; i < kNumFreqBins; ++i) {
    target_cov_mats_[i].Resize(num_input_channels_, num_input_channels_);
    TransposedConjugatedProduct(delay_sum_masks_[i], &target_cov_mats_[i]);
  }
}